

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlAttrSerializeTxtContent(xmlBufferPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  xmlFreeFunc p_Var1;
  xmlOutputBufferPtr buf_00;
  xmlChar *pxVar2;
  uint flags;
  
  if (string == (xmlChar *)0x0 || buf == (xmlBufferPtr)0x0) {
    return;
  }
  buf_00 = xmlOutputBufferCreateBuffer(buf,(xmlCharEncodingHandlerPtr)0x0);
  if ((doc == (xmlDocPtr)0x0) || (flags = 1, doc->encoding == (xmlChar *)0x0)) {
    flags = 3;
  }
  xmlSerializeText(buf_00,string,flags);
  xmlOutputBufferFlush(buf_00);
  p_Var1 = xmlFree;
  if ((buf_00 == (xmlOutputBufferPtr)0x0) || (buf_00->error != 0)) {
    pxVar2 = xmlBufferDetach(buf);
    (*p_Var1)(pxVar2);
  }
  xmlOutputBufferClose(buf_00);
  return;
}

Assistant:

void
xmlAttrSerializeTxtContent(xmlBufferPtr buf, xmlDocPtr doc,
                           xmlAttrPtr attr ATTRIBUTE_UNUSED,
                           const xmlChar *string)
{
    xmlOutputBufferPtr out;

    if ((buf == NULL) || (string == NULL))
        return;
    out = xmlOutputBufferCreateBuffer(buf, NULL);
    xmlBufAttrSerializeTxtContent(out, doc, string);
    xmlOutputBufferFlush(out);
    if ((out == NULL) || (out->error))
        xmlFree(xmlBufferDetach(buf));
    xmlOutputBufferClose(out);
}